

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::ClearPreviousData(FlowBuffer *this)

{
  const_byteptr puVar1;
  
  puVar1 = this->orig_data_end_;
  if ((this->orig_data_begin_ < puVar1) && (this->chunked_ == true)) {
    if (0 < this->frame_length_) {
      this->frame_length_ = this->frame_length_ + ((int)this->orig_data_begin_ - (int)puVar1);
    }
    this->orig_data_begin_ = puVar1;
  }
  return;
}

Assistant:

void FlowBuffer::ClearPreviousData()
	{
	// All previous data must have been processed or buffered already
	if ( orig_data_begin_ < orig_data_end_ )
		{
		BINPAC_ASSERT(buffer_n_ == 0);
		if ( chunked_ )
			{
			if ( frame_length_ > 0 )
				{
				frame_length_ -= (orig_data_end_ - orig_data_begin_);
				}
			orig_data_begin_ = orig_data_end_;
			}
		}
	}